

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_subnegotiation(telnet_t *telnet,uchar telopt,char *buffer,size_t size)

{
  int __flags;
  undefined1 local_2d;
  undefined1 local_2c;
  uchar local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  size_t sStack_28;
  uchar bytes [5];
  size_t size_local;
  char *buffer_local;
  uchar telopt_local;
  telnet_t *telnet_local;
  
  __flags = (int)size;
  local_2d = 0xff;
  local_2c = 0xfa;
  local_2a = 0xff;
  local_29 = 0xf0;
  local_2b = telopt;
  sStack_28 = size;
  _send((int)telnet,&local_2d,3,__flags);
  telnet_send(telnet,buffer,sStack_28);
  _send((int)telnet,&local_2a,2,__flags);
  return;
}

Assistant:

void telnet_subnegotiation(telnet_t *telnet, unsigned char telopt,
		const char *buffer, size_t size) {
	unsigned char bytes[5];
	bytes[0] = TELNET_IAC;
	bytes[1] = TELNET_SB;
	bytes[2] = telopt;
	bytes[3] = TELNET_IAC;
	bytes[4] = TELNET_SE;

	_sendu(telnet, bytes, 3);
	telnet_send(telnet, buffer, size);
	_sendu(telnet, bytes + 3, 2);

#if defined(HAVE_ZLIB)
	/* if we're a proxy and we just sent the COMPRESS2 marker, we must
	 * make sure all further data is compressed if not already.
	 */
	if (telnet->flags & TELNET_FLAG_PROXY &&
			telopt == TELNET_TELOPT_COMPRESS2) {
		telnet_event_t ev;

		if (_init_zlib(telnet, 1, 1) != TELNET_EOK)
			return;

		/* notify app that compression was enabled */
		ev.type = TELNET_EV_COMPRESS;
		ev.compress.state = 1;
		telnet->eh(telnet, &ev, telnet->ud);
	}
#endif /* defined(HAVE_ZLIB) */
}